

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall
front::irGenerator::irGenerator::ir_function_call
          (irGenerator *this,string *retName,SymbolKind kind,string *funcName,
          vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *params,bool begin)

{
  pointer pcVar1;
  pointer pvVar2;
  undefined8 this_00;
  uint32_t uVar3;
  Inst *__tmp;
  VarId *__p;
  CallInst *this_01;
  pointer __rhs;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> paramValues;
  shared_ptr<mir::inst::Inst> callInst;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  VarId *local_128;
  undefined1 local_118 [32];
  byte local_f8;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> local_e8;
  undefined1 local_c8 [16];
  string local_b8;
  shared_ptr<mir::inst::Inst> local_98;
  string *local_88;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> local_80;
  VarId local_68;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  byte local_38;
  
  local_e8.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = funcName;
  if (kind != Ptr) {
    if (kind == VID) {
      local_118._0_8_ = operator_new(0x10);
      uVar3 = this->_VoidVarId;
      (((VarId *)local_118._0_8_)->super_Displayable)._vptr_Displayable =
           (_func_int **)&PTR_display_001eb100;
      ((VarId *)local_118._0_8_)->id = uVar3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::VarId*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
                 (VarId *)local_118._0_8_);
      local_128 = (VarId *)local_118._0_8_;
      local_138 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
      goto LAB_001859de;
    }
    if (kind != INT) {
      local_138 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128 = (VarId *)0x0;
      goto LAB_001859de;
    }
  }
  __p = (VarId *)operator_new(0x10);
  local_58._0_8_ = (long)&local_58 + 0x10;
  pcVar1 = (retName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + retName->_M_string_length);
  local_38 = 1;
  uVar3 = LeftValueToLabelId(this,(LeftVal *)&local_58._M_first);
  (__p->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  __p->id = uVar3;
  local_118._0_8_ = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::VarId*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),__p);
  local_138 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
  local_128 = (VarId *)local_118._0_8_;
  local_118._0_8_ = (VarId *)0x0;
  local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_38]._M_data)
            ((anon_class_1_0_00000001 *)local_c8,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_58._M_first);
  local_38 = 0xff;
LAB_001859de:
  __rhs = (params->
          super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (params->
           super__Vector_base<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pvVar2) {
    do {
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_118,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)__rhs);
      rightValueToValue((irGenerator *)local_c8,(RightVal *)this);
      std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::push_back
                (&local_e8,(value_type *)local_c8._0_8_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_f8]._M_data)
                ((anon_class_1_0_00000001 *)local_c8,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_118);
      __rhs = __rhs + 1;
    } while (__rhs != pvVar2);
  }
  this_01 = (CallInst *)operator_new(0x50);
  local_68.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  local_68.id = local_128->id;
  pcVar1 = (local_88->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + local_88->_M_string_length);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector(&local_80,&local_e8);
  mir::inst::CallInst::CallInst(this_01,&local_68,&local_b8,&local_80);
  local_118._0_8_ = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::CallInst*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),this_01);
  this_00 = local_118._8_8_;
  local_98.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_118._0_8_;
  local_118._0_8_ = 0;
  local_118._8_8_ = 0;
  local_98.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  if ((_Base_ptr)
      local_80.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
      super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_80.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1));
  }
  insertInstruction(this,&local_98,begin);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (local_e8.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
  }
  return;
}

Assistant:

void irGenerator::ir_function_call(string retName, symbol::SymbolKind kind,
                                   string funcName,
                                   std::vector<RightVal> params, bool begin) {
  shared_ptr<VarId> destVarId;
  std::vector<Value> paramValues;
  shared_ptr<mir::inst::Inst> callInst;

  switch (kind) {
    case front::symbol::SymbolKind::Ptr:
    case front::symbol::SymbolKind::INT: {
      destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(retName)));
      break;
    }
    case front::symbol::SymbolKind::VID: {
      destVarId = shared_ptr<VarId>(new VarId(_VoidVarId));
      break;
    }
    default:
      break;
  }

  for (auto var : params) {
    paramValues.push_back(*rightValueToValue(var));
  }

  callInst = shared_ptr<mir::inst::CallInst>(
      new mir::inst::CallInst(*destVarId, funcName, paramValues));

  insertInstruction(callInst, begin);
}